

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_b4327e::X509Test_CriticalExtension_Test::TestBody
          (X509Test_CriticalExtension_Test *this)

{
  _Head_base<0UL,_x509_st_*,_false> _Var1;
  _Head_base<0UL,_evp_pkey_st_*,_false> pkey;
  int iVar2;
  EVP_MD *pEVar3;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *message;
  pointer message_00;
  char *in_R9;
  pointer *__ptr;
  initializer_list<x509_st_*> __l;
  initializer_list<x509_st_*> __l_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  UniquePtr<X509> leaf;
  UniquePtr<X509> root;
  UniquePtr<EVP_PKEY> key;
  UniquePtr<ASN1_BIT_STRING> cert_type;
  undefined1 local_118 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_110;
  pointer local_108;
  string local_f8;
  AssertHelper local_d8 [2];
  vector<X509_crl_st_*,_std::allocator<X509_crl_st_*>_> local_c8;
  allocator_type local_a1;
  internal local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  _Head_base<0UL,_x509_st_*,_false> local_90;
  int local_84;
  _Head_base<0UL,_x509_st_*,_false> local_80;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_78;
  unique_ptr<asn1_string_st,_bssl::internal::Deleter> local_70;
  int local_64;
  _Head_base<0UL,_x509_st_*,_false> local_60;
  _Any_data local_58;
  code *local_48;
  undefined8 uStack_40;
  _Any_data local_38;
  code *local_28;
  undefined8 uStack_20;
  
  PrivateKeyFromPEM((anon_unknown_dwarf_b4327e *)&local_78,
                    "\n-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQgBw8IcnrUoEqc3VnJ\nTYlodwi1b8ldMHcO6NHJzgqLtGqhRANCAATmK2niv2Wfl74vHg2UikzVl2u3qR4N\nRvvdqakendy6WgHn1peoChj5w8SjHlbifINI2xYaHPUdfvGULUvPciLB\n-----END PRIVATE KEY-----\n"
                   );
  local_118[0] = (EVP_PKEY *)local_78._M_head_impl != (EVP_PKEY *)0x0;
  pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((EVP_PKEY *)local_78._M_head_impl == (EVP_PKEY *)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_118,(AssertionResult *)0x607821,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1edc,local_f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl
                  .super__Vector_impl_data._M_start)->sig_alg)();
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
    goto LAB_00417472;
  }
  MakeTestCert((anon_unknown_dwarf_b4327e *)&local_80,"Root","Root",local_78._M_head_impl,true);
  pkey._M_head_impl = local_78._M_head_impl;
  _Var1._M_head_impl = local_80._M_head_impl;
  local_118[0] = (X509 *)local_80._M_head_impl != (X509 *)0x0;
  pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if ((X509 *)local_80._M_head_impl == (X509 *)0x0) {
    testing::Message::Message((Message *)&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f8,(internal *)local_118,(AssertionResult *)0x5c83c3,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
               ,0x1ee0,local_f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
LAB_00417178:
    testing::internal::AssertHelper::~AssertHelper(local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)(*local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl
                  .super__Vector_impl_data._M_start)->sig_alg)();
    }
    if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&pbStack_110,pbStack_110);
    }
  }
  else {
    pEVar3 = EVP_sha256();
    iVar2 = X509_sign((X509 *)_Var1._M_head_impl,(EVP_PKEY *)pkey._M_head_impl,pEVar3);
    local_118[0] = iVar2 != 0;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar2 == 0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f8,(internal *)local_118,
                 (AssertionResult *)"X509_sign(root.get(), key.get(), EVP_sha256())","false","true",
                 in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1ee1,local_f8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
      goto LAB_00417178;
    }
    MakeTestCert((anon_unknown_dwarf_b4327e *)&local_90,"Root","Leaf",local_78._M_head_impl,false);
    local_118[0] = (X509 *)local_90._M_head_impl != (X509 *)0x0;
    pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((X509 *)local_90._M_head_impl == (X509 *)0x0) {
      testing::Message::Message((Message *)&local_c8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_f8,(internal *)local_118,(AssertionResult *)0x5a6039,"false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (local_d8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                 ,0x1ee7,local_f8._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
      testing::internal::AssertHelper::~AssertHelper(local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        (*(code *)(*local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                    _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
      }
      if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&pbStack_110,pbStack_110);
      }
    }
    else {
      local_70._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl =
           (__uniq_ptr_data<asn1_string_st,_bssl::internal::Deleter,_true,_true>)
           ASN1_BIT_STRING_new();
      local_118[0] = (tuple<asn1_string_st_*,_bssl::internal::Deleter>)
                     local_70._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>.
                     _M_t.super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl !=
                     (_Head_base<0UL,_asn1_string_st_*,_false>)0x0;
      pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if ((tuple<asn1_string_st_*,_bssl::internal::Deleter>)
          local_70._M_t.super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl ==
          (_Head_base<0UL,_asn1_string_st_*,_false>)0x0) {
        testing::Message::Message((Message *)&local_c8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_f8,(internal *)local_118,(AssertionResult *)"cert_type","false","true",
                   in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (local_d8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                   ,0x1ee9,local_f8._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
LAB_00417404:
        this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&pbStack_110;
        testing::internal::AssertHelper::~AssertHelper(local_d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if (local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          (*(code *)(*local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                      _M_impl.super__Vector_impl_data._M_start)->sig_alg)();
        }
        local_98 = pbStack_110;
        if (pbStack_110 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
        {
LAB_00417446:
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()(this_00,local_98);
        }
      }
      else {
        iVar2 = ASN1_BIT_STRING_set_bit
                          ((ASN1_BIT_STRING *)
                           local_70._M_t.
                           super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_asn1_string_st_*,_false>._M_head_impl,0,1);
        local_118[0] = iVar2 != 0;
        pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_f8,(internal *)local_118,
                     (AssertionResult *)"ASN1_BIT_STRING_set_bit(cert_type.get(), 0, 1)","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1eea,local_f8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
          goto LAB_00417404;
        }
        iVar2 = X509_add1_ext_i2d((X509 *)local_90._M_head_impl,0x47,
                                  (void *)local_70._M_t.
                                          super___uniq_ptr_impl<asn1_string_st,_bssl::internal::Deleter>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_asn1_string_st_*,_bssl::internal::Deleter>
                                          .super__Head_base<0UL,_asn1_string_st_*,_false>.
                                          _M_head_impl,1,0);
        _Var1._M_head_impl = local_90._M_head_impl;
        local_118[0] = iVar2 != 0;
        pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_f8,(internal *)local_118,
                     (AssertionResult *)"X509_add1_ext_i2d(leaf.get(), 71, cert_type.get(), 1, 0)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1eed,local_f8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
          goto LAB_00417404;
        }
        pEVar3 = EVP_sha256();
        iVar2 = X509_sign((X509 *)_Var1._M_head_impl,(EVP_PKEY *)local_78._M_head_impl,pEVar3);
        _Var1._M_head_impl = local_90._M_head_impl;
        local_118[0] = iVar2 != 0;
        pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar2 == 0) {
          testing::Message::Message((Message *)&local_c8);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_f8,(internal *)local_118,
                     (AssertionResult *)"X509_sign(leaf.get(), key.get(), EVP_sha256())","false",
                     "true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (local_d8,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1eee,local_f8._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(local_d8,(Message *)&local_c8);
          goto LAB_00417404;
        }
        local_84 = 0x22;
        local_60._M_head_impl = local_80._M_head_impl;
        __l._M_len = 1;
        __l._M_array = &local_60._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_f8,__l,&local_a1);
        local_118 = (undefined1  [8])0x0;
        pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_108 = (pointer)0x0;
        local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_38._M_unused._M_object = (void *)0x0;
        local_38._8_8_ = 0;
        local_28 = (code *)0x0;
        uStack_20 = 0;
        local_64 = Verify(_Var1._M_head_impl,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_f8,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_118,&local_c8,0,
                          (function<void_(x509_store_ctx_st_*)> *)&local_38);
        testing::internal::CmpHelperEQ<int,int>
                  (local_a0,"34","Verify(leaf.get(), {root.get()}, {}, {})",&local_84,&local_64);
        if (local_28 != (code *)0x0) {
          (*local_28)(&local_38,&local_38,__destroy_functor);
        }
        if (local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118 != (undefined1  [8])0x0) {
          operator_delete((void *)local_118,(long)local_108 - (long)local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_f8._M_dataplus._M_p,
                          local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
        }
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_f8);
          if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message = "";
          }
          else {
            message = (local_98->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_118,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1ef1,message);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)&local_f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
          }
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_98,local_98);
        }
        local_84 = 0;
        local_60._M_head_impl = local_80._M_head_impl;
        __l_00._M_len = 1;
        __l_00._M_array = &local_60._M_head_impl;
        std::vector<x509_st_*,_std::allocator<x509_st_*>_>::vector
                  ((vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_f8,__l_00,&local_a1);
        local_118 = (undefined1  [8])0x0;
        pbStack_110 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_108 = (pointer)0x0;
        local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58._M_unused._M_object = (void *)0x0;
        local_58._8_8_ = 0;
        local_48 = (code *)0x0;
        uStack_40 = 0;
        local_64 = Verify(local_90._M_head_impl,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)&local_f8,
                          (vector<x509_st_*,_std::allocator<x509_st_*>_> *)local_118,&local_c8,0x10,
                          (function<void_(x509_store_ctx_st_*)> *)&local_58);
        testing::internal::CmpHelperEQ<int,int>
                  (local_a0,"0","Verify(leaf.get(), {root.get()}, {}, {}, 0x10)",&local_84,&local_64
                  );
        if (local_48 != (code *)0x0) {
          (*local_48)(&local_58,&local_58,__destroy_functor);
        }
        if (local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_c8.super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_c8.
                                super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_c8.
                                super__Vector_base<X509_crl_st_*,_std::allocator<X509_crl_st_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if (local_118 != (undefined1  [8])0x0) {
          operator_delete((void *)local_118,(long)local_108 - (long)local_118);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          operator_delete(local_f8._M_dataplus._M_p,
                          local_f8.field_2._M_allocated_capacity - (long)local_f8._M_dataplus._M_p);
        }
        if (local_a0[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_f8);
          if (local_98 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            message_00 = "";
          }
          else {
            message_00 = (local_98->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)local_118,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509_test.cc"
                     ,0x1ef3,message_00);
          testing::internal::AssertHelper::operator=((AssertHelper *)local_118,(Message *)&local_f8)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            (**(code **)(*(size_type *)local_f8._M_dataplus._M_p + 8))();
          }
        }
        if (local_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_98;
          goto LAB_00417446;
        }
      }
      std::unique_ptr<asn1_string_st,_bssl::internal::Deleter>::~unique_ptr(&local_70);
    }
    std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_90);
  }
  std::unique_ptr<x509_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<x509_st,_bssl::internal::Deleter> *)&local_80);
LAB_00417472:
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_78);
  return;
}

Assistant:

TEST(X509Test, CriticalExtension) {
  bssl::UniquePtr<EVP_PKEY> key = PrivateKeyFromPEM(kP256Key);
  ASSERT_TRUE(key);

  bssl::UniquePtr<X509> root =
      MakeTestCert("Root", "Root", key.get(), /*is_ca=*/true);
  ASSERT_TRUE(root);
  ASSERT_TRUE(X509_sign(root.get(), key.get(), EVP_sha256()));

  // Issue a certificate with a critical Netscape certificate type extension. We
  // do not recognize this extension, so this certificate should be rejected.
  bssl::UniquePtr<X509> leaf =
      MakeTestCert("Root", "Leaf", key.get(), /*is_ca=*/false);
  ASSERT_TRUE(leaf);
  bssl::UniquePtr<ASN1_BIT_STRING> cert_type(ASN1_BIT_STRING_new());
  ASSERT_TRUE(cert_type);
  ASSERT_TRUE(ASN1_BIT_STRING_set_bit(cert_type.get(), /*n=*/0, /*value=*/1));
  ASSERT_TRUE(X509_add1_ext_i2d(leaf.get(), NID_netscape_cert_type,
                                cert_type.get(),
                                /*crit=*/1, /*flags=*/0));
  ASSERT_TRUE(X509_sign(leaf.get(), key.get(), EVP_sha256()));

  EXPECT_EQ(X509_V_ERR_UNHANDLED_CRITICAL_EXTENSION,
            Verify(leaf.get(), {root.get()}, {}, {}));
  EXPECT_EQ(X509_V_OK, Verify(leaf.get(), {root.get()}, {}, {},
                              X509_V_FLAG_IGNORE_CRITICAL));
}